

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall wabt::interp::Thread::DoSimdRelaxedMadd<float>(Thread *this)

{
  undefined1 auVar1 [16];
  Value VVar2;
  Value VVar3;
  Value VVar4;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  VVar2 = Pop(this);
  VVar3 = Pop(this);
  VVar4 = Pop(this);
  local_28 = (float)VVar3.field_0.f32_;
  uStack_24 = VVar3.field_0._4_4_;
  uStack_20 = VVar3.field_0._8_4_;
  uStack_1c = VVar3.field_0._12_4_;
  local_18 = (float)VVar2.field_0.f32_;
  uStack_14 = VVar2.field_0._4_4_;
  uStack_10 = VVar2.field_0._8_4_;
  uStack_c = VVar2.field_0._12_4_;
  auVar1._0_8_ = CONCAT44(VVar4.field_0._4_4_ * uStack_24 + uStack_14,
                          (float)VVar4.field_0.f32_ * local_28 + local_18);
  auVar1._8_4_ = VVar4.field_0._8_4_ * uStack_20 + uStack_10;
  auVar1._12_4_ = VVar4.field_0._12_4_ * uStack_1c + uStack_c;
  VVar2.field_0._8_8_ = auVar1._8_8_;
  VVar2.field_0.i64_ = auVar1._0_8_;
  Push(this,VVar2);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdRelaxedMadd() {
  using SS = typename Simd128<S>::Type;
  auto c = Pop<SS>();
  auto b = Pop<SS>();
  auto a = Pop<SS>();
  SS result;
  for (u8 i = 0; i < SS::lanes; ++i) {
    result[i] = a[i] * b[i] + c[i];
  }
  Push(result);
  return RunResult::Ok;
}